

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

bool __thiscall clickhouse::Client::Impl::ReceiveHello(Impl *this)

{
  CodedInputStream *this_00;
  ulong uVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint64_t len;
  uint64_t packet_type;
  ulong local_30;
  uint64_t local_28;
  
  local_28 = 0;
  this_00 = &this->input_;
  bVar2 = CodedInputStream::ReadVarint64(this_00,&local_28);
  if (bVar2) {
    if (local_28 == 2) {
      ReceiveException(this,true);
    }
    else if (((local_28 == 0) && (bVar2 = CodedInputStream::ReadVarint64(this_00,&local_30), bVar2))
            && (local_30 < 0x1000000)) {
      std::__cxx11::string::resize((ulong)&this->server_info_,(char)local_30);
      bVar2 = CodedInputStream::ReadRaw(this_00,(this->server_info_).name._M_dataplus._M_p,local_30)
      ;
      if (!bVar2) {
        return false;
      }
      bVar2 = CodedInputStream::ReadVarint64(this_00,&(this->server_info_).version_major);
      if ((bVar2) &&
         (bVar2 = CodedInputStream::ReadVarint64(this_00,&(this->server_info_).version_minor), bVar2
         )) {
        puVar3 = &(this->server_info_).revision;
        bVar2 = CodedInputStream::ReadVarint64(this_00,puVar3);
        if (((bVar2) &&
            ((*puVar3 < 0xd32a ||
             (bVar2 = WireFormat::ReadString(this_00,&(this->server_info_).timezone), bVar2)))) &&
           ((*puVar3 < 0xd464 ||
            (bVar2 = WireFormat::ReadString(this_00,&(this->server_info_).display_name), bVar2)))) {
          uVar1 = (this->server_info_).revision;
          puVar3 = &(this->server_info_).version_patch;
          if (uVar1 < 0xd481) {
            *puVar3 = uVar1;
          }
          else {
            bVar2 = CodedInputStream::ReadVarint64(this_00,puVar3);
            if (!bVar2) {
              return false;
            }
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Client::Impl::ReceiveHello() {
    uint64_t packet_type = 0;

    if (!input_.ReadVarint64(&packet_type)) {
        return false;
    }

    if (packet_type == ServerCodes::Hello) {
        if (!WireFormat::ReadString(&input_, &server_info_.name)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.version_major)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.version_minor)) {
            return false;
        }
        if (!WireFormat::ReadUInt64(&input_, &server_info_.revision)) {
            return false;
        }

        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_SERVER_TIMEZONE) {
            if (!WireFormat::ReadString(&input_, &server_info_.timezone)) {
                return false;
            }
        }
        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_SERVER_DISPLAY_NAME) {
            if (!WireFormat::ReadString(&input_, &server_info_.display_name)) {
                return false;
            }
        }
        if (server_info_.revision >= DBMS_MIN_REVISION_WITH_VERSION_PATCH) {
            if (!WireFormat::ReadUInt64(&input_, &server_info_.version_patch)) {
                return false;
            }
        } else {
            server_info_.version_patch = server_info_.revision;
        }

        return true;
    } else if (packet_type == ServerCodes::Exception) {
        ReceiveException(true);
        return false;
    }

    return false;
}